

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleTestApprovalsTests.cpp
# Opt level: O0

void __thiscall
GoogleTestApprovalsTests_TestStreamableObject_Test::TestBody
          (GoogleTestApprovalsTests_TestStreamableObject_Test *this)

{
  Options *this_00;
  Options *local_78;
  undefined8 uStack_70;
  Options *options;
  undefined8 contents;
  
  options = (Options *)0x0;
  contents = (int *)0x0;
  local_78 = (Options *)0x0;
  uStack_70._0_1_ = (_Alloc_hider)0x0;
  uStack_70._1_7_ = 0;
  this_00 = (Options *)&local_78;
  ApprovalTests::Options::Options((Options *)0x0);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verify<int,int>((int *)contents,options);
  ApprovalTests::Options::~Options(this_00);
  return;
}

Assistant:

TEST(GoogleTestApprovalsTests, TestStreamableObject)
{
    Approvals::verify(42);
}